

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_DistributionMapping.cpp
# Opt level: O1

void amrex::DistributionMapping::ComputeDistributionMappingEfficiency
               (DistributionMapping *dm,Vector<double,_std::allocator<double>_> *cost,
               Real *efficiency)

{
  vector<double,std::allocator<double>> *this;
  int iVar1;
  element_type *peVar2;
  pointer pdVar3;
  iterator __position;
  long lVar4;
  pointer pdVar5;
  size_type sVar6;
  long lVar7;
  long lVar8;
  double *pdVar9;
  size_type __n;
  double dVar10;
  double dVar11;
  Vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  rankToCosts;
  Vector<int,_std::allocator<int>_> cnt;
  Vector<double,_std::allocator<double>_> rankToCost;
  allocator_type local_81;
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  local_80;
  vector<int,_std::allocator<int>_> local_68;
  Real *local_50;
  vector<double,_std::allocator<double>_> local_48;
  
  iVar1 = *(int *)(ParallelContext::frames + 0x10);
  __n = (size_type)iVar1;
  std::
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_80,__n,(allocator_type *)&local_68);
  std::vector<int,_std::allocator<int>_>::vector(&local_68,__n,(allocator_type *)&local_48);
  peVar2 = (dm->m_ref).
           super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar7 = *(long *)&(peVar2->m_pmap).super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl;
  lVar4 = (long)*(pointer *)
                 ((long)&(peVar2->m_pmap).super_vector<int,_std::allocator<int>_>.
                         super__Vector_base<int,_std::allocator<int>_>._M_impl + 8) - lVar7 >> 2;
  if (0 < lVar4) {
    lVar8 = 0;
    do {
      local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[*(int *)(lVar7 + lVar8 * 4)] =
           local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[*(int *)(lVar7 + lVar8 * 4)] + 1;
      lVar8 = lVar8 + 1;
    } while (lVar4 != lVar8);
  }
  local_50 = efficiency;
  if (local_80.
      super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_80.
      super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start &&
      -1 < (long)local_80.
                 super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)local_80.
                 super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::reserve
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_80.
                           super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super_vector<double,_std::allocator<double>_>).
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar4),
                 (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[lVar7]);
      lVar7 = lVar7 + 1;
      lVar8 = ((long)local_80.
                     super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_80.
                     super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar4 = lVar4 + 0x18;
    } while (lVar8 - lVar7 != 0 && lVar7 <= lVar8);
  }
  pdVar5 = (cost->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_start;
  pdVar3 = (cost->super_vector<double,_std::allocator<double>_>).
           super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
           _M_finish;
  if (pdVar3 != pdVar5 && -1 < (long)pdVar3 - (long)pdVar5) {
    lVar4 = 0;
    lVar7 = 0;
    do {
      this = (vector<double,std::allocator<double>> *)
             (local_80.
              super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start +
             *(int *)(*(long *)&(((dm->m_ref).
                                  super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar7 * 4));
      __position._M_current = *(double **)(this + 8);
      if (__position._M_current == *(double **)(this + 0x10)) {
        std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
                  (this,__position,(double *)((long)pdVar5 + lVar4));
      }
      else {
        *__position._M_current = *(double *)((long)pdVar5 + lVar4);
        *(double **)(this + 8) = __position._M_current + 1;
      }
      lVar7 = lVar7 + 1;
      pdVar5 = (cost->super_vector<double,_std::allocator<double>_>).
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      lVar4 = lVar4 + 8;
    } while (lVar7 < (long)(cost->super_vector<double,_std::allocator<double>_>).
                           super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish - (long)pdVar5 >> 3);
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_48,__n,&local_81);
  if (iVar1 < 1) {
    dVar10 = -1.0;
  }
  else {
    sVar6 = 0;
    dVar11 = -1.0;
    do {
      dVar10 = 0.0;
      for (pdVar9 = local_80.
                    super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar6].
                    super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar9 != local_80.
                    super__Vector_base<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[sVar6].
                    super_vector<double,_std::allocator<double>_>.
                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish; pdVar9 = pdVar9 + 1) {
        dVar10 = dVar10 + *pdVar9;
      }
      local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start[sVar6] = dVar10;
      if (dVar10 <= dVar11) {
        dVar10 = dVar11;
      }
      sVar6 = sVar6 + 1;
      dVar11 = dVar10;
    } while (sVar6 != __n);
  }
  dVar11 = 0.0;
  for (pdVar9 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      pdVar9 != local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar9 = pdVar9 + 1) {
    dVar11 = dVar11 + *pdVar9;
  }
  *local_50 = dVar11 / (dVar10 * (double)iVar1);
  if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<amrex::Vector<double,_std::allocator<double>_>,_std::allocator<amrex::Vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_80);
  return;
}

Assistant:

void
DistributionMapping::ComputeDistributionMappingEfficiency (const DistributionMapping& dm,
                                                           const Vector<Real>& cost,
                                                           Real* efficiency)
{
    const int nprocs = ParallelDescriptor::NProcs();

    // This will store mapping from processor to the costs of FABs it controls,
    // (proc) --> ([cost_FAB_1, cost_FAB_2, ... ]),
    // for each proc
    Vector<Vector<Real>> rankToCosts(nprocs);

    // Count the number of costs belonging to each rank
    Vector<int> cnt(nprocs);
    for (int i=0; i<dm.size(); ++i)
    {
        ++cnt[dm[i]];
    }

    for (int i=0; i<rankToCosts.size(); ++i)
    {
        rankToCosts[i].reserve(cnt[i]);
    }

    for (int i=0; i<cost.size(); ++i)
    {
        rankToCosts[dm[i]].push_back(cost[i]);
    }

    Real maxCost = -1.0;

    // This will store mapping from (proc) --> (sum of cost) for each proc
    Vector<Real> rankToCost(nprocs);
    for (int i=0; i<nprocs; ++i)
    {
        const Real rwSum = std::accumulate(rankToCosts[i].begin(),
                                           rankToCosts[i].end(), 0.0_rt);
        rankToCost[i] = rwSum;
        maxCost = std::max(maxCost, rwSum);
    }

    // Write `efficiency` (number between 0 and 1), the mean cost per processor
    // (normalized to the max cost)
    *efficiency = (std::accumulate(rankToCost.begin(),
                                   rankToCost.end(), 0.0_rt) / (nprocs*maxCost));
}